

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_8::DiskFilesystem::DiskFilesystem(DiskFilesystem *this)

{
  undefined1 local_2c [28];
  DiskFilesystem *local_10;
  DiskFilesystem *this_local;
  
  local_10 = this;
  Filesystem::Filesystem(&this->super_Filesystem);
  (this->super_Filesystem)._vptr_Filesystem = (_func_int **)&PTR_getRoot_00ce3cf8;
  openDir((DiskFilesystem *)(local_2c + 0x14),"/");
  DiskDirectory::DiskDirectory(&this->root,(AutoCloseFd *)(local_2c + 0x14));
  AutoCloseFd::~AutoCloseFd((AutoCloseFd *)(local_2c + 0x14));
  openDir((DiskFilesystem *)local_2c,".");
  DiskDirectory::DiskDirectory(&this->current,(AutoCloseFd *)local_2c);
  AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_2c);
  computeCurrentPath();
  return;
}

Assistant:

DiskFilesystem()
      : root(openDir("/")),
        current(openDir(".")),
        currentPath(computeCurrentPath()) {}